

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

X * __thiscall IMLE::predict(IMLE *this,Z *z)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  pointer pMVar4;
  pointer pMVar5;
  pointer pdVar6;
  iterator iVar7;
  pointer pFVar8;
  long lVar9;
  pointer piVar10;
  double *pdVar11;
  double dVar12;
  _Alloc_hider _Var13;
  Mat *pMVar14;
  double *pdVar15;
  undefined8 *puVar16;
  Index index_4;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  size_type sVar20;
  long lVar21;
  Index index;
  Index index_1;
  Index index_3;
  ulong uVar22;
  long lVar23;
  long lVar24;
  Index size_1;
  pointer pMVar25;
  ActualDstType actualDst;
  long lVar26;
  double __tmp;
  Scal SVar27;
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  X sumInvRj;
  X sumInvRxj;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_88;
  string local_70;
  ArrayScal *local_50;
  ArrayX *local_48;
  Mat *local_40 [2];
  
  pMVar4 = (this->predictions).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar5 = (this->predictions).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar25 = pMVar4;
  if (pMVar5 != pMVar4) {
    do {
      free((pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data);
      pMVar25 = pMVar25 + 1;
    } while (pMVar25 != pMVar5);
    (this->predictions).
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar4;
  }
  pMVar4 = (this->predictionsVar).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar5 = (this->predictionsVar).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar25 = pMVar4;
  if (pMVar5 != pMVar4) {
    do {
      free((pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data);
      pMVar25 = pMVar25 + 1;
    } while (pMVar25 != pMVar5);
    (this->predictionsVar).
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar4;
  }
  pdVar6 = (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar6) {
    (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar6;
  }
  if ((z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      (long)this->d) {
    if (this->M < 1) {
      dVar29 = 0.0;
    }
    else {
      dVar29 = 0.0;
      lVar26 = 0;
      lVar24 = 0;
      do {
        SVar27 = LinearExpert::queryZ
                           ((LinearExpert *)
                            ((long)&(((this->experts).
                                      super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                      .
                                      super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert
                                    ).d + lVar26),z);
        dVar29 = dVar29 + SVar27;
        lVar24 = lVar24 + 1;
        lVar26 = lVar26 + 0x308;
      } while (lVar24 < this->M);
    }
    pdVar15 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    if ((this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != 1) {
      free(pdVar15);
      pdVar15 = (double *)malloc(8);
      if (pdVar15 == (double *)0x0) goto LAB_00148b05;
      (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data = pdVar15;
    }
    (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         = 1;
    *pdVar15 = dVar29;
    dVar29 = dVar29 + this->pNoiseModelZ;
    pdVar15 = (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data;
    if ((this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != 1) {
      free(pdVar15);
      pdVar15 = (double *)malloc(8);
      if (pdVar15 == (double *)0x0) goto LAB_00148b05;
      (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar15;
    }
    (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 1
    ;
    *pdVar15 = dVar29;
    this->sumAll = dVar29;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"IMLE::predict: query dimension does not match input dimension!!"
               ,"");
    message(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    pdVar15 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    if ((this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != 1) {
      free(pdVar15);
      pdVar15 = (double *)malloc(8);
      if (pdVar15 == (double *)0x0) goto LAB_00148b05;
      (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data = pdVar15;
    }
    (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         = 1;
    *pdVar15 = 0.0;
  }
  local_48 = &this->predictionsVar;
  local_50 = &this->predictionsWeight;
  dVar29 = *(this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_data;
  iVar19 = this->M;
  lVar24 = (long)iVar19;
  if ((dVar29 != 0.0) || (NAN(dVar29))) {
    lVar26 = lVar24;
    if ((this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != lVar24) {
      free((this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      if (iVar19 < 1) {
        pdVar15 = (double *)0x0;
      }
      else {
        pdVar15 = (double *)malloc(lVar24 * 8);
        if (pdVar15 == (double *)0x0) goto LAB_00148b05;
      }
      (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data = pdVar15;
      iVar19 = this->M;
      lVar26 = (long)iVar19;
    }
    (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = lVar24;
    lVar24 = (long)this->D;
    if ((iVar19 == 0 || lVar24 == 0) ||
       (lVar24 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar26),0))) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&this->fInvRj,lVar26 * lVar24,lVar24,lVar26)
      ;
      lVar26 = (long)this->D;
      lVar24 = (long)this->M;
      if ((lVar24 == 0 || lVar26 == 0) ||
         (lVar26 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar24),0)))
      {
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                  ((DenseStorage<double,__1,__1,__1,_0> *)&this->invRxj,lVar24 * lVar26,lVar26,
                   lVar24);
        if (0 < this->M) {
          lVar24 = 0;
          lVar26 = 0;
          do {
            pFVar8 = (this->experts).
                     super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     .
                     super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            dVar29 = pFVar8[lVar26].super_LinearExpert.gamma *
                     pFVar8[lVar26].super_LinearExpert.p_z_T +
                     *(this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data;
            (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_data[lVar26] = dVar29;
            pdVar15 = (this->fInvRj).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data;
            uVar18 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                     .m_storage.m_rows;
            uVar17 = uVar18;
            if ((((ulong)(pdVar15 + uVar18 * lVar26) & 7) == 0) &&
               (uVar17 = (ulong)((uint)((ulong)(pdVar15 + uVar18 * lVar26) >> 3) & 1),
               (long)uVar18 <= (long)uVar17)) {
              uVar17 = uVar18;
            }
            dVar29 = pFVar8[lVar26].super_LinearExpert.p_z_T / dVar29;
            lVar9 = *(long *)&pFVar8[lVar26].super_LinearExpert.invPsi.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
            if (0 < (long)uVar17) {
              uVar22 = 0;
              do {
                *(double *)((long)pdVar15 + uVar22 * 8 + uVar18 * lVar24) =
                     *(double *)(lVar9 + uVar22 * 8) * dVar29;
                uVar22 = uVar22 + 1;
              } while (uVar17 != uVar22);
            }
            lVar23 = uVar18 - uVar17;
            uVar22 = (lVar23 - (lVar23 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
            if (1 < lVar23) {
              do {
                pdVar11 = (double *)(lVar9 + uVar17 * 8);
                dVar12 = pdVar11[1];
                pdVar1 = (double *)((long)pdVar15 + uVar17 * 8 + uVar18 * lVar24);
                *pdVar1 = *pdVar11 * dVar29;
                pdVar1[1] = dVar12 * dVar29;
                uVar17 = uVar17 + 2;
              } while ((long)uVar17 < (long)uVar22);
            }
            if ((long)uVar22 < (long)uVar18) {
              do {
                *(double *)((long)pdVar15 + uVar22 * 8 + uVar18 * lVar24) =
                     *(double *)(lVar9 + uVar22 * 8) * dVar29;
                uVar22 = uVar22 + 1;
              } while (uVar18 != uVar22);
            }
            pdVar15 = (this->fInvRj).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data;
            lVar9 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows;
            pdVar11 = (this->invRxj).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data;
            uVar18 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                     .m_storage.m_rows;
            lVar23 = *(long *)&(this->experts).
                               super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                               .
                               super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar26].super_LinearExpert.
                               pred_x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            ;
            uVar17 = uVar18;
            if ((((ulong)(pdVar11 + uVar18 * lVar26) & 7) == 0) &&
               (uVar17 = (ulong)((uint)((ulong)(pdVar11 + uVar18 * lVar26) >> 3) & 1),
               (long)uVar18 <= (long)uVar17)) {
              uVar17 = uVar18;
            }
            if (0 < (long)uVar17) {
              uVar22 = 0;
              do {
                *(double *)((long)pdVar11 + uVar22 * 8 + uVar18 * lVar24) =
                     *(double *)((long)pdVar15 + uVar22 * 8 + lVar9 * lVar24) *
                     *(double *)(lVar23 + uVar22 * 8);
                uVar22 = uVar22 + 1;
              } while (uVar17 != uVar22);
            }
            lVar21 = uVar18 - uVar17;
            uVar22 = (lVar21 - (lVar21 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
            if (1 < lVar21) {
              do {
                pdVar1 = (double *)(lVar23 + uVar17 * 8);
                dVar29 = pdVar1[1];
                pdVar2 = (double *)((long)pdVar15 + uVar17 * 8 + lVar9 * lVar24);
                dVar12 = pdVar2[1];
                pdVar3 = (double *)((long)pdVar11 + uVar17 * 8 + uVar18 * lVar24);
                *pdVar3 = *pdVar2 * *pdVar1;
                pdVar3[1] = dVar12 * dVar29;
                uVar17 = uVar17 + 2;
              } while ((long)uVar17 < (long)uVar22);
            }
            if ((long)uVar22 < (long)uVar18) {
              do {
                *(double *)((long)pdVar11 + uVar22 * 8 + uVar18 * lVar24) =
                     *(double *)((long)pdVar15 + uVar22 * 8 + lVar9 * lVar24) *
                     *(double *)(lVar23 + uVar22 * 8);
                uVar22 = uVar22 + 1;
              } while (uVar18 != uVar22);
            }
            lVar26 = lVar26 + 1;
            lVar24 = lVar24 + 8;
          } while (lVar26 < this->M);
        }
        local_40[0] = &this->fInvRj;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double,double>,1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_70,
                   (DenseBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>_>
                    *)local_40);
        local_88.m_storage.m_data = (double *)&this->invRxj;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double,double>,1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_40,
                   (DenseBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>_>
                    *)&local_88);
        local_88.m_storage.m_data = (double *)0x0;
        local_88.m_storage.m_rows = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_88,local_70._M_string_length,1);
        pMVar14 = local_40[0];
        _Var13._M_p = local_70._M_dataplus._M_p;
        sVar20 = local_70._M_string_length;
        if (local_88.m_storage.m_rows != local_70._M_string_length) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_88,local_70._M_string_length,1);
          sVar20 = local_88.m_storage.m_rows;
        }
        uVar18 = sVar20 - ((long)sVar20 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < (long)sVar20) {
          lVar24 = 0;
          do {
            auVar28 = divpd(*(undefined1 (*) [16])
                             (&(pMVar14->
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                               m_storage.m_data + lVar24),
                            *(undefined1 (*) [16])(_Var13._M_p + lVar24 * 8));
            *(undefined1 (*) [16])(local_88.m_storage.m_data + lVar24) = auVar28;
            lVar24 = lVar24 + 2;
          } while (lVar24 < (long)uVar18);
        }
        if ((long)uVar18 < (long)sVar20) {
          do {
            local_88.m_storage.m_data[uVar18] =
                 (double)(&(pMVar14->
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                           m_storage.m_data)[uVar18] / *(double *)(_Var13._M_p + uVar18 * 8);
            uVar18 = uVar18 + 1;
          } while (sVar20 != uVar18);
        }
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back(&this->predictions,(value_type *)&local_88);
        free(local_88.m_storage.m_data);
        local_88.m_storage.m_data = (double *)0x0;
        local_88.m_storage.m_rows = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_88,local_70._M_string_length,1);
        _Var13._M_p = local_70._M_dataplus._M_p;
        if (local_88.m_storage.m_rows != local_70._M_string_length) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_88,local_70._M_string_length,1);
          local_70._M_string_length = local_88.m_storage.m_rows;
        }
        auVar28 = _DAT_0018bd00;
        uVar18 = local_70._M_string_length - ((long)local_70._M_string_length >> 0x3f) &
                 0xfffffffffffffffe;
        if (1 < (long)local_70._M_string_length) {
          lVar24 = 0;
          do {
            auVar31 = divpd(auVar28,*(undefined1 (*) [16])(_Var13._M_p + lVar24 * 8));
            *(undefined1 (*) [16])(local_88.m_storage.m_data + lVar24) = auVar31;
            lVar24 = lVar24 + 2;
          } while (lVar24 < (long)uVar18);
        }
        if ((long)uVar18 < (long)local_70._M_string_length) {
          do {
            local_88.m_storage.m_data[uVar18] = 1.0 / *(double *)(_Var13._M_p + uVar18 * 8);
            uVar18 = uVar18 + 1;
          } while (local_70._M_string_length != uVar18);
        }
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back(local_48,(value_type *)&local_88);
        free(local_88.m_storage.m_data);
        local_88.m_storage.m_data =
             (double *)
             (*(this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data / this->sumAll);
        iVar7._M_current =
             (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                    (local_50,iVar7,(value_type *)&local_88);
        }
        else {
          *iVar7._M_current = (double)local_88.m_storage.m_data;
          (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
        free(local_40[0]);
        free(local_70._M_dataplus._M_p);
        goto LAB_00148a2b;
      }
    }
  }
  else {
    if ((this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != lVar24) {
      free((this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      if (iVar19 < 1) {
        pdVar15 = (double *)0x0;
      }
      else {
        pdVar15 = (double *)malloc(lVar24 * 8);
        if (pdVar15 == (double *)0x0) goto LAB_00148b05;
      }
      (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data = pdVar15;
    }
    (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = lVar24;
    auVar31 = _DAT_0018a020;
    auVar28 = _DAT_0018a010;
    if (0 < iVar19) {
      SVar27 = this->pNoiseModelZ;
      pdVar15 = (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
      uVar18 = lVar24 + 0x1fffffffffffffffU & 0x1fffffffffffffff;
      auVar30._8_4_ = (int)uVar18;
      auVar30._0_8_ = uVar18;
      auVar30._12_4_ = (int)(uVar18 >> 0x20);
      lVar26 = 0;
      auVar30 = auVar30 ^ _DAT_0018a020;
      do {
        auVar32._8_4_ = (int)lVar26;
        auVar32._0_8_ = lVar26;
        auVar32._12_4_ = (int)((ulong)lVar26 >> 0x20);
        auVar32 = (auVar32 | auVar28) ^ auVar31;
        if ((bool)(~(auVar32._4_4_ == auVar30._4_4_ && auVar30._0_4_ < auVar32._0_4_ ||
                    auVar30._4_4_ < auVar32._4_4_) & 1)) {
          pdVar15[lVar26] = SVar27;
        }
        if ((auVar32._12_4_ != auVar30._12_4_ || auVar32._8_4_ <= auVar30._8_4_) &&
            auVar32._12_4_ <= auVar30._12_4_) {
          pdVar15[lVar26 + 1] = SVar27;
        }
        lVar26 = lVar26 + 2;
      } while ((uVar18 - ((uint)(lVar24 + 0x1fffffffffffffffU) & 1)) + 2 != lVar26);
    }
    lVar26 = (long)this->D;
    lVar24 = (long)this->M;
    if ((lVar24 == 0 || lVar26 == 0) ||
       (lVar26 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar24),0))) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&this->fInvRj,lVar24 * lVar26,lVar26,lVar24)
      ;
      lVar24 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols *
               (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      if (0 < lVar24) {
        memset((this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data,0,lVar24 * 8);
      }
      lVar26 = (long)this->D;
      lVar24 = (long)this->M;
      if ((lVar24 == 0 || lVar26 == 0) ||
         (lVar26 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar24),0)))
      {
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                  ((DenseStorage<double,__1,__1,__1,_0> *)&this->invRxj,lVar24 * lVar26,lVar26,
                   lVar24);
        lVar24 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols *
                 (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        if (0 < lVar24) {
          memset((this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data,0,lVar24 * 8);
        }
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back(&this->predictions,&this->zeroX);
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back(local_48,&this->infinityX);
        local_70._M_dataplus._M_p = (pointer)0x0;
        iVar7._M_current =
             (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                    (local_50,iVar7,(value_type *)&local_70);
        }
        else {
          *iVar7._M_current = 0.0;
          (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
LAB_00148a2b:
        this->nSolFound = 1;
        piVar10 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar10) {
          (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar10;
        }
        std::vector<int,_std::allocator<int>_>::resize(&this->sNearest,(long)this->M,0);
        this->solIdx = 0;
        pdVar15 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
        uVar18 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows;
        if ((this->zQuery).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows != uVar18) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&(this->zQuery).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                     uVar18,1);
          uVar18 = (this->zQuery).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
        }
        pdVar11 = (this->zQuery).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data;
        uVar17 = uVar18 - ((long)uVar18 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < (long)uVar18) {
          lVar24 = 0;
          do {
            pdVar1 = pdVar15 + lVar24;
            dVar29 = pdVar1[1];
            pdVar2 = pdVar11 + lVar24;
            *pdVar2 = *pdVar1;
            pdVar2[1] = dVar29;
            lVar24 = lVar24 + 2;
          } while (lVar24 < (long)uVar17);
        }
        if ((long)uVar17 < (long)uVar18) {
          do {
            pdVar11[uVar17] = pdVar15[uVar17];
            uVar17 = uVar17 + 1;
          } while (uVar18 != uVar17);
        }
        this->hasPredJacobian = false;
        this->hasPredErrorReductionDrvt = false;
        return (this->predictions).
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start + this->solIdx;
      }
    }
  }
LAB_00148b05:
  puVar16 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar16 = operator_delete;
  __cxa_throw(puVar16,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::X const &IMLE_base::predict(Z const &z)
{

    // Clear predict data structure
    predictions.clear();
    predictionsVar.clear();
    predictionsWeight.clear();

#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( z.size() != d )
    {
        message("IMLE::predict: query dimension does not match input dimension!!");

        sum_p_z.setZero(1);
    }
    else
#endif
    {
        Scal sum_p = 0.0;
        for(int j = 0; j < M; j++)
            sum_p += experts[j].queryZ(z);
        sum_p_z.setConstant(1, sum_p);
        sumW.setConstant(1, sum_p + pNoiseModelZ);
        sumAll = sumW(0);
    }

    if(sum_p_z(0) == 0.0)  // This happens when a prediction is sought too far from the current mixture
    {
        varPhiAuxj.setConstant(M,pNoiseModelZ);
        fInvRj.setZero(D,M);
        invRxj.setZero(D,M);

        predictions.push_back(zeroX);
        predictionsVar.push_back(infinityX);
        predictionsWeight.push_back(0.0);
    }
    else
    {
        varPhiAuxj.resize(M);
        fInvRj.resize(D,M);
        invRxj.resize(D,M);
        for(int j = 0; j < M; j++)
        {
            varPhiAuxj(j) = experts[j].getGamma() * experts[j].get_p_z() + sumW(0);
            fInvRj.col(j) = experts[j].getPredXInvVar() * (experts[j].get_p_z() / varPhiAuxj(j));
            invRxj.col(j) = fInvRj.col(j).asDiagonal() * experts[j].getPredX();
        }

        // Update storage results
        X sumInvRj = fInvRj.rowwise().sum();
        X sumInvRxj = invRxj.rowwise().sum();

        predictions.push_back( sumInvRxj.cwiseQuotient(sumInvRj) );
        predictionsVar.push_back( sumInvRj.cwiseInverse() );
        predictionsWeight.push_back( sum_p_z(0) / sumAll );
    }

    nSolFound = 1;
    sNearest.clear();
    sNearest.resize(M,0);

    solIdx = 0;

    zQuery = z;
    hasPredJacobian = false;
    hasPredErrorReductionDrvt = false;

    return predictions[solIdx];
}